

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_prepare_pop(Parser *this)

{
  size_t *psVar1;
  code *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  bool bVar8;
  State *pSVar9;
  ulong uVar10;
  State *pSVar11;
  
  uVar10 = (this->m_stack).m_size;
  if (uVar10 < 2) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00246018)
              ("check failed: m_stack.size() > 1",0x20,(anonymous_namespace)::s_default_callbacks);
    uVar10 = (this->m_stack).m_size;
    if (uVar10 == 0) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      to_csubstr(
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                );
      (*(code *)PTR_error_impl_00246018)
                ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
      uVar10 = (this->m_stack).m_size;
    }
    pSVar9 = (this->m_stack).m_stack;
    pSVar11 = pSVar9 + (uVar10 - 1);
    if (uVar10 < 2) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      to_csubstr(
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                );
      (*(code *)PTR_error_impl_00246018)
                ("check failed: i < m_size",0x18,(anonymous_namespace)::s_default_callbacks);
      pSVar9 = (this->m_stack).m_stack;
      uVar10 = (this->m_stack).m_size;
    }
  }
  else {
    pSVar9 = (this->m_stack).m_stack;
    pSVar11 = pSVar9 + (uVar10 - 1);
  }
  pSVar9[uVar10 - 2].pos.name.len = (pSVar11->pos).name.len;
  sVar3 = (pSVar11->pos).super_LineCol.offset;
  sVar4 = (pSVar11->pos).super_LineCol.line;
  pcVar5 = (pSVar11->pos).name.str;
  psVar1 = &pSVar9[uVar10 - 2].pos.super_LineCol.col;
  *psVar1 = (pSVar11->pos).super_LineCol.col;
  psVar1[1] = (size_t)pcVar5;
  pSVar9[uVar10 - 2].pos.super_LineCol.offset = sVar3;
  pSVar9[uVar10 - 2].pos.super_LineCol.line = sVar4;
  sVar3 = (pSVar11->line_contents).full.len;
  pcVar5 = (pSVar11->line_contents).stripped.str;
  sVar4 = (pSVar11->line_contents).stripped.len;
  pcVar6 = (pSVar11->line_contents).rem.str;
  sVar7 = (pSVar11->line_contents).rem.len;
  pSVar9[uVar10 - 2].line_contents.full.str = (pSVar11->line_contents).full.str;
  pSVar9[uVar10 - 2].line_contents.full.len = sVar3;
  pSVar9[uVar10 - 2].line_contents.stripped.str = pcVar5;
  pSVar9[uVar10 - 2].line_contents.stripped.len = sVar4;
  pSVar9[uVar10 - 2].line_contents.rem.str = pcVar6;
  pSVar9[uVar10 - 2].line_contents.rem.len = sVar7;
  pSVar9[uVar10 - 2].line_contents.indentation = (pSVar11->line_contents).indentation;
  sVar3 = (pSVar11->scalar).len;
  pSVar9[uVar10 - 2].scalar.str = (pSVar11->scalar).str;
  pSVar9[uVar10 - 2].scalar.len = sVar3;
  return;
}

Assistant:

void _prepare_pop()
    {
        RYML_ASSERT(m_stack.size() > 1);
        State const& curr = m_stack.top();
        State      & next = m_stack.top(1);
        next.pos = curr.pos;
        next.line_contents = curr.line_contents;
        next.scalar = curr.scalar;
    }